

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_scalar_fe_space.h
# Opt level: O0

shared_ptr<const_lf::mesh::Mesh> __thiscall
lf::fe::HierarchicScalarFESpace<double>::Mesh(HierarchicScalarFESpace<double> *this)

{
  bool bVar1;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<const_lf::mesh::Mesh> sVar2;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  HierarchicScalarFESpace<double> *this_local;
  
  this_local = this;
  bVar1 = std::operator==((shared_ptr<const_lf::mesh::Mesh> *)(in_RSI + 8),(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"No valid FE space object: no mesh");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"mesh_p_ != nullptr",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_scalar_fe_space.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x7a,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
            ((shared_ptr<const_lf::mesh::Mesh> *)this,
             (shared_ptr<const_lf::mesh::Mesh> *)(in_RSI + 8));
  sVar2.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_lf::mesh::Mesh>)
         sVar2.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

[[nodiscard]] std::shared_ptr<const lf::mesh::Mesh> Mesh() const override {
    LF_VERIFY_MSG(mesh_p_ != nullptr, "No valid FE space object: no mesh");
    return mesh_p_;
  }